

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::TestCheckRewriteString(char *regexp,char *rewrite,bool expect_ok)

{
  ostream *poVar1;
  LogMessage local_2c0;
  StringPiece local_140;
  undefined1 local_12d;
  bool actual_ok;
  undefined1 local_120 [8];
  RE2 exp;
  string error;
  bool expect_ok_local;
  char *rewrite_local;
  char *regexp_local;
  
  std::__cxx11::string::string((string *)&exp.named_groups_once_);
  RE2::RE2((RE2 *)local_120,regexp);
  StringPiece::StringPiece(&local_140,rewrite);
  local_12d = RE2::CheckRewriteString((RE2 *)local_120,&local_140,(string *)&exp.named_groups_once_)
  ;
  if (expect_ok != (bool)local_12d) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xc2);
    poVar1 = LogMessage::stream(&local_2c0);
    poVar1 = std::operator<<(poVar1,"Check failed: (expect_ok) == (actual_ok)");
    poVar1 = std::operator<<(poVar1," for ");
    poVar1 = std::operator<<(poVar1,rewrite);
    poVar1 = std::operator<<(poVar1," error: ");
    std::operator<<(poVar1,(string *)&exp.named_groups_once_);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c0);
  }
  RE2::~RE2((RE2 *)local_120);
  std::__cxx11::string::~string((string *)&exp.named_groups_once_);
  return;
}

Assistant:

static void TestCheckRewriteString(const char* regexp, const char* rewrite,
                              bool expect_ok) {
  string error;
  RE2 exp(regexp);
  bool actual_ok = exp.CheckRewriteString(rewrite, &error);
  EXPECT_EQ(expect_ok, actual_ok) << " for " << rewrite << " error: " << error;
}